

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRFactory.h
# Opt level: O1

void __thiscall
MinVR::VRFactory::registerItemType<MinVR::VRDisplayNode,MinVR::VRConsoleNode>
          (VRFactory *this,string *typeName)

{
  pointer pcVar1;
  VRItemFactory *factory;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->_registeredTypes,typeName);
  factory = (VRItemFactory *)operator_new(0x28);
  factory->_vptr_VRItemFactory = (_func_int **)&PTR__VRSpecificItemFactory_00176408;
  factory[1]._vptr_VRItemFactory = (_func_int **)(factory + 3);
  pcVar1 = (typeName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(factory + 1),pcVar1,pcVar1 + typeName->_M_string_length);
  factory->_vptr_VRItemFactory = (_func_int **)&PTR__VRSpecificItemFactory_00176390;
  addSubFactory(this,factory);
  return;
}

Assistant:

void VRFactory::registerItemType(const std::string typeName) {

  _registeredTypes.push_back(typeName);

  addSubFactory(new VRConcreteItemFactory<ParentType, T>(typeName));
}